

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

void __thiscall Character::DeathRespawn(Character *this)

{
  int iVar1;
  World *pWVar2;
  EOClient *pEVar3;
  bool bVar4;
  uchar uVar5;
  short sVar6;
  mapped_type *pmVar7;
  Map *pMVar8;
  pointer pvVar9;
  double dVar10;
  allocator<char> local_10b;
  array<char,_2UL> local_10a;
  string local_108;
  PacketReader local_e8;
  allocator<char> local_bb;
  array<char,_2UL> local_ba;
  string local_b8;
  PacketReader local_98;
  allocator<char> local_69;
  key_type local_68;
  allocator<char> local_31;
  key_type local_30;
  Character *local_10;
  Character *this_local;
  
  iVar1 = this->maxhp;
  pWVar2 = this->world;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"DeathRecover",&local_31);
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar2->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_30);
  dVar10 = util::variant::operator_cast_to_double(pmVar7);
  this->hp = (int)(((double)iVar1 * dVar10) / 100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pWVar2 = this->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Deadly",&local_69);
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar2->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_68);
  bVar4 = util::variant::operator_cast_to_bool(pmVar7);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  if (bVar4) {
    DropAll(this,(Character *)0x0);
  }
  Map::Leave(this->map,this,WARP_ANIMATION_NONE,true);
  this->nowhere = true;
  pWVar2 = this->world;
  sVar6 = SpawnMap(this);
  pMVar8 = World::GetMap(pWVar2,sVar6);
  this->map = pMVar8;
  sVar6 = SpawnMap(this);
  this->mapid = sVar6;
  uVar5 = SpawnX(this);
  this->x = uVar5;
  uVar5 = SpawnY(this);
  this->y = uVar5;
  pEVar3 = this->player->client;
  local_ba._M_elems[0] = -0x80;
  local_ba._M_elems[1] = '\0';
  pvVar9 = std::array<char,_2UL>::data(&local_ba);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pvVar9,&local_bb);
  PacketReader::PacketReader(&local_98,&local_b8);
  ActionQueue::AddAction(&pEVar3->queue,&local_98,1.5,false);
  PacketReader::~PacketReader(&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_bb);
  pEVar3 = this->player->client;
  local_10a._M_elems[0] = -0x7f;
  local_10a._M_elems[1] = '\0';
  pvVar9 = std::array<char,_2UL>::data(&local_10a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,pvVar9,&local_10b);
  PacketReader::PacketReader(&local_e8,&local_108);
  ActionQueue::AddAction(&pEVar3->queue,&local_e8,0.0,false);
  PacketReader::~PacketReader(&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_10b);
  return;
}

Assistant:

void Character::DeathRespawn()
{
	this->hp = int(this->maxhp * static_cast<double>(this->world->config["DeathRecover"]) / 100.0);

	if (this->world->config["Deadly"])
	{
		this->DropAll(nullptr);
	}

	this->map->Leave(this, WARP_ANIMATION_NONE, true);
	this->nowhere = true;
	this->map = this->world->GetMap(this->SpawnMap());
	this->mapid = this->SpawnMap();
	this->x = this->SpawnX();
	this->y = this->SpawnY();

	this->player->client->queue.AddAction(PacketReader(std::array<char, 2>{
		{char(PACKET_INTERNAL_NULL), char(PACKET_INTERNAL)}
	}.data()), 1.5);

	this->player->client->queue.AddAction(PacketReader(std::array<char, 2>{
		{char(PACKET_INTERNAL_WARP), char(PACKET_INTERNAL)}
	}.data()), 0.0);
}